

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  uint size;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  pair<const_char_*,_int> pVar6;
  
  bVar1 = *ptr;
  size = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar6 = ReadSizeFallback(ptr,(uint)bVar1);
    pcVar3 = pVar6.first;
    size = pVar6.second;
  }
  else {
    pcVar3 = ptr + 1;
  }
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    if (this->unknown_ != (string *)0x0) {
      uVar5 = (ulong)(num * 8 + 2);
      cVar4 = (char)this->unknown_;
      if (0x7f < num << 3) {
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar2);
      }
      std::__cxx11::string::push_back(cVar4);
      uVar5 = (ulong)(int)size;
      cVar4 = (char)this->unknown_;
      if (0x7f < size) {
        do {
          std::__cxx11::string::push_back(cVar4);
          bVar2 = 0x3fff < uVar5;
          uVar5 = uVar5 >> 7;
        } while (bVar2);
      }
      std::__cxx11::string::push_back(cVar4);
      pcVar3 = EpsCopyInputStream::AppendString
                         (&ctx->super_EpsCopyInputStream,pcVar3,size,this->unknown_);
      return pcVar3;
    }
    if ((long)((ctx->super_EpsCopyInputStream).buffer_end_ + (0x10 - (long)pcVar3)) <
        (long)(int)size) {
      pcVar3 = EpsCopyInputStream::SkipFallback(&ctx->super_EpsCopyInputStream,pcVar3,size);
      return pcVar3;
    }
    pcVar3 = pcVar3 + (int)size;
  }
  return pcVar3;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }